

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_iccputuint(jas_stream_t *out,int n,unsigned_long_long val)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  uint local_3c;
  uint local_38;
  uint local_34;
  int local_2c;
  int c;
  int i;
  unsigned_long_long val_local;
  int n_local;
  jas_stream_t *out_local;
  
  local_2c = n;
  while( true ) {
    if (local_2c < 1) {
      return 0;
    }
    uVar3 = val >> (((char)local_2c + -1) * '\b' & 0x3fU);
    local_38 = (uint)uVar3 & 0xff;
    if ((out->flags_ & 7U) == 0) {
      if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
        out->bufmode_ = out->bufmode_ | 0x20;
        iVar2 = out->cnt_ + -1;
        out->cnt_ = iVar2;
        if (iVar2 < 0) {
          local_38 = jas_stream_flushbuf(out,local_38);
        }
        else {
          out->rwcnt_ = out->rwcnt_ + 1;
          puVar1 = out->ptr_;
          out->ptr_ = puVar1 + 1;
          *puVar1 = (uchar)uVar3;
        }
        local_34 = local_38;
      }
      else {
        out->flags_ = out->flags_ | 4;
        local_34 = 0xffffffff;
      }
      local_3c = local_34;
    }
    else {
      local_3c = 0xffffffff;
    }
    if (local_3c == 0xffffffff) break;
    local_2c = local_2c + -1;
  }
  return -1;
}

Assistant:

static int jas_iccputuint(jas_stream_t *out, int n, jas_ulonglong val)
{
	int i;
	int c;
	for (i = n; i > 0; --i) {
		c = (val >> (8 * (i - 1))) & 0xff;
		if (jas_stream_putc(out, c) == EOF)
			return -1;
	}
	return 0;
}